

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O1

void __thiscall
crsGA::Logger::log_recursive(Logger *this,LogLevel logLevel,char *file,int line,ostringstream *msg)

{
  double __x;
  long *local_48;
  long local_38 [2];
  
  __x = (double)std::__cxx11::stringbuf::str();
  log(this,__x);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

void log_recursive(LogLevel logLevel, const char* file, int line, std::ostringstream& msg)
        {
            log(logLevel, file, line, msg.str());
        }